

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1.c
# Opt level: O0

void ssh1_login_free(PacketProtocolLayer *ppl)

{
  toplevel_callback_fn_t local_20;
  size_t i;
  ssh1_login_state *s;
  PacketProtocolLayer *ppl_local;
  
  if (ppl[-6].selfptr != (PacketProtocolLayer **)0x0) {
    ssh_ppl_free((PacketProtocolLayer *)ppl[-6].selfptr);
  }
  conf_free((Conf *)ppl[-6].logctx);
  safefree(ppl[-6].seat);
  safefree(*(void **)&ppl[-5].ic_process_queue.queued);
  safefree(ppl[-5].out_pq);
  if (ppl[-4].vt != (PacketProtocolLayerVtable *)0x0) {
    strbuf_free((strbuf *)ppl[-4].vt);
  }
  safefree(ppl[-4].bpp);
  if (ppl[-4].out_pq != (PktOutQueue *)0x0) {
    free_prompts((prompts_t *)ppl[-4].out_pq);
  }
  if (ppl[-3].ic_process_queue.ctx != (void *)0x0) {
    for (local_20 = (toplevel_callback_fn_t)0x0; local_20 < ppl[-3].ic_process_queue.fn;
        local_20 = local_20 + 1) {
      freersakey((RSAKey *)((long)ppl[-3].ic_process_queue.ctx + (long)local_20 * 0x60));
      strbuf_free(*(strbuf **)((long)ppl[-3].ic_process_queue.ctx + (long)local_20 * 0x60 + 0x48));
    }
    safefree(ppl[-3].ic_process_queue.ctx);
  }
  safefree(ppl[-4].seat);
  if (ppl[-5].ic_process_queue.fn != (toplevel_callback_fn_t)0x0) {
    agent_cancel_query((agent_pending_query *)ppl[-5].ic_process_queue.fn);
  }
  safefree(&ppl[-6].ic_process_queue.queued);
  return;
}

Assistant:

static void ssh1_login_free(PacketProtocolLayer *ppl)
{
    struct ssh1_login_state *s =
        container_of(ppl, struct ssh1_login_state, ppl);

    if (s->successor_layer)
        ssh_ppl_free(s->successor_layer);

    conf_free(s->conf);
    sfree(s->savedhost);
    sfree(s->rsabuf);
    sfree(s->username);
    if (s->publickey_blob)
        strbuf_free(s->publickey_blob);
    sfree(s->publickey_comment);
    if (s->cur_prompt)
        free_prompts(s->cur_prompt);
    if (s->agent_keys) {
        for (size_t i = 0; i < s->agent_keys_len; i++) {
            freersakey(&s->agent_keys[i].key);
            strbuf_free(s->agent_keys[i].comment);
        }
        sfree(s->agent_keys);
    }
    sfree(s->agent_response_to_free);
    if (s->auth_agent_query)
        agent_cancel_query(s->auth_agent_query);
    sfree(s);
}